

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringWrapperExample.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Rectangle3 *rectangle)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[x: ",4);
  poVar1 = (ostream *)std::ostream::operator<<(os,rectangle->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," y: ",4);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," width: ",8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," height: ",9);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Rectangle3& rectangle)
    {
        os << "[x: " << rectangle.x << " y: " << rectangle.y
           << " width: " << rectangle.width << " height: " << rectangle.height << "]";
        return os;
    }